

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendInteger(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  Distance *pDVar4;
  undefined4 in_EDX;
  char in_SIL;
  long in_RDI;
  optional<metaf::Distance> v;
  bool in_stack_000000cf;
  string *in_stack_000000d0;
  Distance *in_stack_ffffffffffffffd0;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (uVar2 = std::__cxx11::string::length(), 3 < uVar2)) {
    return false;
  }
  lVar3 = std::__cxx11::string::find(in_SIL,0x2f);
  if (lVar3 != -1) {
    return false;
  }
  bVar1 = Distance::isReported(in_stack_ffffffffffffffd0);
  if (!bVar1) {
    Distance::fromMileString(in_stack_000000d0,in_stack_000000cf);
    bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x2441ab);
    if (!bVar1) {
      return false;
    }
    pDVar4 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x2441c0);
    *(undefined8 *)(in_RDI + 4) = *(undefined8 *)pDVar4;
    *(undefined8 *)(in_RDI + 0xc) =
         *(undefined8 *)
          &(pDVar4->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
    *(undefined4 *)(in_RDI + 0x58) = in_EDX;
    return true;
  }
  return false;
}

Assistant:

bool VisibilityGroup::appendInteger(const std::string & group, IncompleteText next) {
	if (group.empty() || group.length() > 3) return false;
	if (group.find('/') != std::string::npos) return false;
	if (vis.isReported()) return false;
	const auto v = Distance::fromMileString(group, true);
	if (!v.has_value()) return false;
	vis = *v;
	incompleteText = next;
	return true;
}